

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O0

string * cmStrCat<char[13],std::__cxx11::string>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [13],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  cmAlphaNum local_e0;
  cmAlphaNum local_b0;
  string_view local_80;
  string_view local_70;
  string_view local_60;
  string_view local_50;
  iterator local_40;
  undefined8 local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [13];
  cmAlphaNum *b_local;
  cmAlphaNum *a_local;
  
  local_30 = args_1;
  args_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (char (*) [13])b;
  b_local = a;
  a_local = (cmAlphaNum *)__return_storage_ptr__;
  local_80 = cmAlphaNum::View(a);
  local_70 = cmAlphaNum::View((cmAlphaNum *)args_local);
  cmAlphaNum::cmAlphaNum(&local_b0,(char *)args_local_1);
  local_60 = cmAlphaNum::View(&local_b0);
  cmAlphaNum::cmAlphaNum(&local_e0,local_30);
  local_50 = cmAlphaNum::View(&local_e0);
  local_40 = &local_80;
  local_38 = 4;
  views._M_len = 4;
  views._M_array = local_40;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}